

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzDD::NodeIntStateGather(ChNodeFEAxyzDD *this)

{
  uint in_ECX;
  ChState *in_RDX;
  uint in_ESI;
  ChStateDelta *in_R8;
  double *in_R9;
  
  NodeIntStateGather((ChNodeFEAxyzDD *)
                     ((long)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                             _vptr_ChNodeFEAbase +
                     (long)(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                           _vptr_ChNodeFEAbase[-6]),in_ESI,in_RDX,in_ECX,in_R8,in_R9);
  return;
}

Assistant:

void ChNodeFEAxyzDD::NodeIntStateGather(const unsigned int off_x,
                                        ChState& x,
                                        const unsigned int off_v,
                                        ChStateDelta& v,
                                        double& T) {
    x.segment(off_x + 0, 3) = pos.eigen();
    x.segment(off_x + 3, 3) = D.eigen();
    x.segment(off_x + 6, 3) = DD.eigen();

    v.segment(off_v + 0, 3) = pos_dt.eigen();
    v.segment(off_v + 3, 3) = D_dt.eigen();
    v.segment(off_v + 6, 3) = DD_dt.eigen();
}